

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::BuildLayers(S2Builder *this)

{
  pointer pGVar1;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> _Var2;
  IsFullPolygonPredicate is_full_polygon_predicate;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  long lVar7;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  ulong uVar8;
  undefined8 uVar9;
  _Manager_type p_Var10;
  _Invoker_type p_Var11;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  layer_vertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  layer_input_edge_ids;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  layer_edges;
  function<bool_(const_S2Builder::Graph_&,_S2Error_*)> local_168;
  Graph graph;
  IdSetLexicon input_edge_id_set_lexicon;
  
  layer_edges.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_edges.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer_edges.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layer_input_edge_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_input_edge_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer_input_edge_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IdSetLexicon::IdSetLexicon(&input_edge_id_set_lexicon);
  BuildLayerEdges(this,&layer_edges,&layer_input_edge_ids,&input_edge_id_set_lexicon);
  graph.options_._0_8_ =
       (this->input_vertices_).
       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  graph.options_._8_8_ =
       (this->input_vertices_).
       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  graph._16_8_ = (this->input_vertices_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
            ((_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&graph);
  graph.options_._0_8_ =
       (this->input_edges_).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  graph.options_._8_8_ =
       (this->input_edges_).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  graph._16_8_ = (this->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->input_edges_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_edges_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_edges_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&graph);
  graph.options_._0_8_ =
       (this->edge_sites_).
       super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  graph.options_._8_8_ =
       (this->edge_sites_).
       super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  graph._16_8_ = (this->edge_sites_).
                 super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::~vector((vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             *)&graph);
  layer_vertices.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layer_vertices.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_vertices.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0;
  p_Var11 = (_Invoker_type)0x0;
  p_Var10 = (_Manager_type)0x0;
  for (uVar8 = 0;
      pvVar6 = layer_edges.
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pvVar5 = layer_input_edge_ids.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pvVar4 = layer_vertices.
               super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pvVar3 = layer_vertices.
               super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->layers_).
                            super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->layers_).
                            super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    pGVar1 = (this->layer_options_).
             super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0x1f1317;
    std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::function
              (&local_168,
               (function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)
               ((long)&(((this->layer_is_full_polygon_predicates_).
                         super__Vector_base<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                       _M_functor + lVar7));
    vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
               (p_Var10 +
               (long)&pvVar3->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               );
    if (pvVar3 == pvVar4) {
      vertices = &this->sites_;
    }
    is_full_polygon_predicate.super__Function_base._M_functor._8_8_ = uVar9;
    is_full_polygon_predicate.super__Function_base._M_functor._M_unused._M_object = &local_168;
    is_full_polygon_predicate.super__Function_base._M_manager = p_Var10;
    is_full_polygon_predicate._M_invoker = p_Var11;
    Graph::Graph(&graph,(GraphOptions *)(p_Var11 + (long)pGVar1),vertices,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 (p_Var10 +
                 (long)&pvVar6->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                 ),(vector<int,_std::allocator<int>_> *)
                   (p_Var10 + (long)&pvVar5->super__Vector_base<int,_std::allocator<int>_>),
                 &input_edge_id_set_lexicon,&this->label_set_ids_,&this->label_set_lexicon_,
                 is_full_polygon_predicate);
    std::_Function_base::~_Function_base(&local_168.super__Function_base);
    _Var2._M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
    super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
         (this->layers_).
         super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
         super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                          .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 0x18))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
               super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,&graph,this->error_);
    std::_Function_base::~_Function_base(&graph.is_full_polygon_predicate_.super__Function_base);
    p_Var10 = p_Var10 + 0x18;
    p_Var11 = p_Var11 + 0x14;
    lVar7 = lVar7 + 0x20;
  }
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector(&layer_vertices);
  IdSetLexicon::~IdSetLexicon(&input_edge_id_set_lexicon);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&layer_input_edge_ids);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&layer_edges);
  return;
}

Assistant:

void S2Builder::BuildLayers() {
  // Each output edge has an "input edge id set id" (an int32) representing
  // the set of input edge ids that were snapped to this edge.  The actual
  // InputEdgeIds can be retrieved using "input_edge_id_set_lexicon".
  vector<vector<Edge>> layer_edges;
  vector<vector<InputEdgeIdSetId>> layer_input_edge_ids;
  IdSetLexicon input_edge_id_set_lexicon;
  BuildLayerEdges(&layer_edges, &layer_input_edge_ids,
                  &input_edge_id_set_lexicon);

  // At this point we have no further need for the input geometry or nearby
  // site data, so we clear those fields to save space.
  vector<S2Point>().swap(input_vertices_);
  vector<InputEdge>().swap(input_edges_);
  vector<compact_array<SiteId>>().swap(edge_sites_);

  // If there are a large number of layers, then we build a minimal subset of
  // vertices for each layer.  This ensures that layer types that iterate over
  // vertices will run in time proportional to the size of that layer rather
  // than the size of all layers combined.
  vector<vector<S2Point>> layer_vertices;
  static const int kMinLayersForVertexFiltering = 10;
  if (layers_.size() >= kMinLayersForVertexFiltering) {
    // Disable vertex filtering if it is disallowed by any layer.  (This could
    // be optimized, but in current applications either all layers allow
    // filtering or none of them do.)
    bool allow_vertex_filtering = false;
    for (const auto& options : layer_options_) {
      allow_vertex_filtering &= options.allow_vertex_filtering();
    }
    if (allow_vertex_filtering) {
      vector<Graph::VertexId> filter_tmp;  // Temporary used by FilterVertices.
      layer_vertices.resize(layers_.size());
      for (int i = 0; i < layers_.size(); ++i) {
        layer_vertices[i] = Graph::FilterVertices(sites_, &layer_edges[i],
                                                  &filter_tmp);
      }
      vector<S2Point>().swap(sites_);  // Release memory
    }
  }
  for (int i = 0; i < layers_.size(); ++i) {
    const vector<S2Point>& vertices = (layer_vertices.empty() ?
                                       sites_ : layer_vertices[i]);
    Graph graph(layer_options_[i], &vertices, &layer_edges[i],
                &layer_input_edge_ids[i], &input_edge_id_set_lexicon,
                &label_set_ids_, &label_set_lexicon_,
                layer_is_full_polygon_predicates_[i]);
    layers_[i]->Build(graph, error_);
    // Don't free the layer data until all layers have been built, in order to
    // support building multiple layers at once (e.g. ClosedSetNormalizer).
  }
}